

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountCase::genVertexAttribData
          (OutputCountCase *this)

{
  pointer pVVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  undefined4 uVar7;
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexPosData,(long)this->m_primitiveCount);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,(long)this->m_primitiveCount);
  uVar4 = this->m_primitiveCount;
  uVar5 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      fVar6 = (float)(int)uVar3 / (float)(int)uVar5;
      pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pVVar1->m_data + lVar2 + -8) = 0xbf800000;
      *(float *)((long)pVVar1->m_data + lVar2 + -4) = fVar6 + fVar6 + -1.0;
      *(undefined8 *)((long)pVVar1->m_data + lVar2) = 0x3f80000000000000;
      uVar7 = 0x3f800000;
      if ((uVar3 & 1) != 0) {
        uVar7 = 0;
      }
      pVVar1 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pVVar1->m_data + lVar2 + -8) = 0x3f800000;
      *(undefined4 *)((long)pVVar1->m_data + lVar2 + -4) = uVar7;
      *(undefined4 *)((long)pVVar1->m_data + lVar2) = uVar7;
      *(undefined4 *)((long)pVVar1->m_data + lVar2 + 4) = 0x3f800000;
      uVar3 = uVar3 + 1;
      uVar4 = this->m_primitiveCount;
      uVar5 = (ulong)(int)uVar4;
      lVar2 = lVar2 + 0x10;
    } while ((long)uVar3 < (long)uVar5);
  }
  (this->super_GeometryShaderRenderTest).m_numDrawVertices = uVar4;
  return;
}

Assistant:

void OutputCountCase::genVertexAttribData (void)
{
	m_vertexPosData.resize(m_primitiveCount);
	m_vertexAttrData.resize(m_primitiveCount);

	for (int ndx = 0; ndx < m_primitiveCount; ++ndx)
	{
		m_vertexPosData[ndx] = tcu::Vec4(-1.0f, ((float)ndx) / (float)m_primitiveCount * 2.0f - 1.0f, 0.0f, 1.0f);
		m_vertexAttrData[ndx] = (ndx % 2 == 0) ? tcu::Vec4(1, 1, 1, 1) : tcu::Vec4(1, 0, 0, 1);
	}

	m_numDrawVertices = m_primitiveCount;
}